

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O2

ParseResults __thiscall
bubbleJson::BubbleJson::ParseObject(BubbleJson *this,BubbleValue *bubbleValue)

{
  _Rb_tree_node_base *p_Var1;
  BubbleContext *pBVar2;
  char *pcVar3;
  char cVar4;
  ParseResults PVar5;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>,std::_Select1st<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>>
  *this_00;
  _Rb_tree_node_base *p_Var6;
  size_t length;
  char *c_str;
  string string;
  BubbleValue valueTmp;
  
  pBVar2 = this->context;
  Expect(this,'{');
  ParseWhitespace(this);
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>,std::_Select1st<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>>
             *)operator_new(0x30);
  p_Var1 = (_Rb_tree_node_base *)(this_00 + 8);
  *(undefined4 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(_Rb_tree_node_base **)(this_00 + 0x18) = p_Var1;
  *(_Rb_tree_node_base **)(this_00 + 0x20) = p_Var1;
  *(undefined8 *)(this_00 + 0x28) = 0;
  (bubbleValue->u).string.literal = (char *)this_00;
  pcVar3 = pBVar2->json;
  cVar4 = *pcVar3;
  if (cVar4 == '}') {
    bubbleValue->type = ValueType_Object;
    pBVar2->json = pcVar3 + 1;
LAB_0010f941:
    PVar5 = ParseResult_Ok;
  }
  else {
    while (cVar4 == '\"') {
      PVar5 = ParseStringRaw(this,&c_str,&length);
      if (PVar5 != ParseResult_Ok) goto LAB_0010fa86;
      string._M_dataplus._M_p = (pointer)&string.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&string,c_str,c_str + length);
      ParseWhitespace(this);
      if (*pBVar2->json != ':') {
        std::__cxx11::string::~string((string *)&string);
        PVar5 = ParseResult_MissColon;
        goto LAB_0010fa86;
      }
      pBVar2->json = pBVar2->json + 1;
      ParseWhitespace(this);
      BubbleValue::BubbleValue(&valueTmp);
      PVar5 = ParseValue(this,&valueTmp);
      if (PVar5 != ParseResult_Ok) {
LAB_0010fa70:
        BubbleValue::~BubbleValue(&valueTmp);
        std::__cxx11::string::~string((string *)&string);
        goto LAB_0010fa86;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>,std::_Select1st<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>>
      ::_M_emplace_unique<std::__cxx11::string&,bubbleJson::BubbleValue&>(this_00,&string,&valueTmp)
      ;
      ParseWhitespace(this);
      pcVar3 = pBVar2->json;
      if (*pcVar3 != ',') {
        PVar5 = ParseResult_MissCommaOrCurlyBracket;
        if (*pcVar3 != '}') goto LAB_0010fa70;
        pBVar2->json = pcVar3 + 1;
        bubbleValue->type = ValueType_Object;
        BubbleValue::~BubbleValue(&valueTmp);
        std::__cxx11::string::~string((string *)&string);
        goto LAB_0010f941;
      }
      pBVar2->json = pcVar3 + 1;
      ParseWhitespace(this);
      BubbleValue::~BubbleValue(&valueTmp);
      std::__cxx11::string::~string((string *)&string);
      cVar4 = *pBVar2->json;
    }
    PVar5 = ParseResult_MissKey;
LAB_0010fa86:
    for (p_Var6 = *(_Rb_tree_node_base **)(this_00 + 0x18); p_Var6 != p_Var1;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      BubbleValue::MemoryFreeValue((BubbleValue *)(p_Var6 + 2));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                 *)this_00);
    operator_delete(this_00);
    (bubbleValue->u).number = 0.0;
  }
  return PVar5;
}

Assistant:

ParseResults BubbleJson::ParseObject(BubbleValue *bubbleValue)
{
    BubbleContext* c = this->context;
    ParseResults result;

    Expect('{');
    ParseWhitespace();

    map<string, BubbleValue>* members = new map<string, BubbleValue>;
    bubbleValue->u.object.members = members;

    if (*c->json == '}')
    {
        bubbleValue->type = ValueType_Object;
        c->json++;
        return ParseResult_Ok;
    }
    while (true)
    {
        char* c_str;
        size_t length;

        if (*c->json != '"')
        {
            result = ParseResult_MissKey;
            break;
        }
        if ((result = ParseStringRaw(&c_str, &length)) != ParseResult_Ok)
            break;
        string string(c_str,length);

        ParseWhitespace();
        if (*c->json == ':')
        {
            c->json++;
            ParseWhitespace();
        }
        else
        {
            result = ParseResult_MissColon;
            break;
        }

        BubbleValue valueTmp;
        if ((result = ParseValue(&valueTmp)) != ParseResult_Ok)
            break;
        members->emplace(string, valueTmp);

        ParseWhitespace();
        if (*c->json == ',')
        {
            c->json++;
            ParseWhitespace();
        }
        else if (*c->json == '}')
        {
            c->json++;
            bubbleValue->type = ValueType_Object;
            return ParseResult_Ok;
        }
        else
        {
            result = ParseResult_MissCommaOrCurlyBracket;
            break;
        }
    }

    for (auto it = members->begin(); it != members->end(); ++it)
    {
        //delete (it->first);
        it->second.MemoryFreeValue();
    }
    delete members;
    bubbleValue->u.object.members = nullptr;
    return result;
}